

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O0

void __thiscall Server::echo_handler(Server *this,connection_hdl *hdl,message_ptr *msg)

{
  initializer_list_t init;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  string *psVar4;
  ostream *this_00;
  char *pcVar5;
  reference key;
  size_type sVar6;
  float *pfVar7;
  endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio> *in_RDI;
  float fVar8;
  json tmp;
  int jj;
  Vector3f tv;
  pair<ParamType,_void_*> *p_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  t_1;
  iterator __end5;
  iterator __begin5;
  PARAMLIST_TYPE *__range5;
  int edt;
  json u_1;
  Vector3f v;
  pair<ParamType,_void_*> *p;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  t;
  iterator __end2;
  iterator __begin2;
  PARAMLIST_TYPE *__range2;
  json u;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  j;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  *in_stack_fffffffffffffab8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
  *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffad0;
  char *in_stack_fffffffffffffad8;
  const_reference in_stack_fffffffffffffae0;
  char (*in_stack_fffffffffffffb20) [6];
  undefined4 in_stack_fffffffffffffb28;
  float in_stack_fffffffffffffb2c;
  reference in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  size_type in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb80;
  size_type in_stack_fffffffffffffb88;
  allocator *paVar9;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffbc8;
  undefined1 allow_exceptions;
  parser_callback_t *in_stack_fffffffffffffbd0;
  input_adapter *in_stack_fffffffffffffbd8;
  undefined1 ****local_3e0;
  string local_340 [32];
  undefined1 local_320 [64];
  int local_2e0;
  Vector3f local_2dc;
  int *local_2d0;
  undefined4 local_2c4;
  int local_2a0 [4];
  _Self local_290;
  _Self local_288;
  _Manager_type *local_280;
  int local_278;
  error_handler_t in_stack_fffffffffffffd8c;
  string local_270 [2];
  undefined1 in_stack_fffffffffffffd92;
  char in_stack_fffffffffffffd93;
  int in_stack_fffffffffffffd94;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd98;
  ostream *in_stack_fffffffffffffda0;
  string local_250 [32];
  undefined1 local_230 [71];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  undefined1 local_1a8 [32];
  undefined8 ***local_188;
  undefined1 ***local_180 [4];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined8 ***local_120;
  undefined8 local_118;
  Vector3f local_100;
  undefined4 local_f4;
  undefined4 local_dc;
  int *local_c8;
  int local_a0 [2];
  undefined4 *local_98;
  _Self local_90;
  _Self local_88;
  _Manager_type *local_80;
  
  allow_exceptions = (undefined1)((ulong)in_stack_fffffffffffffbc8 >> 0x38);
  peVar3 = std::
           __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ba087);
  psVar4 = websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>
           ::get_payload_abi_cxx11_(peVar3);
  this_00 = std::operator<<((ostream *)&std::cerr,(string *)psVar4);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  peVar3 = std::
           __shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ba0ba);
  websocketpp::message_buffer::message<websocketpp::message_buffer::alloc::con_msg_manager>::
  get_payload_abi_cxx11_(peVar3);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,(bool)allow_exceptions);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               *)0x2ba124);
  nlohmann::detail::input_adapter::~input_adapter((input_adapter *)0x2ba131);
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
  ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  bVar1 = nlohmann::operator==<const_char_*,_0>(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8)
  ;
  if (bVar1) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
    local_80 = &in_RDI[1].super_transport_type.super_socket_type.m_socket_init_handler.
                super__Function_base._M_manager;
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
                  *)in_stack_fffffffffffffab8);
    local_90._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
                *)in_stack_fffffffffffffab8);
    while (bVar1 = std::operator!=(&local_88,&local_90), bVar1) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>
      ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>
                   *)0x2ba1e8);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
      ::pair(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      local_c8 = local_a0;
      if (local_a0[0] == 0) {
        local_dc = *local_98;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<int,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffac0,(int *)in_stack_fffffffffffffab8);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator[](in_stack_fffffffffffffb30,
                     (key_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(in_stack_fffffffffffffad0,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_fffffffffffffac8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_fffffffffffffac0);
      }
      else if (local_a0[0] == 1) {
        local_f4 = *local_98;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<float,_float,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffac0,(float *)in_stack_fffffffffffffab8);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator[](in_stack_fffffffffffffb30,
                     (key_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(in_stack_fffffffffffffad0,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_fffffffffffffac8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_fffffffffffffac0);
      }
      else if (local_a0[0] == 2) {
        Vector3f::Vector3f((Vector3f *)in_stack_fffffffffffffac0,
                           (Vector3f *)in_stack_fffffffffffffab8);
        local_188 = local_180;
        Vector3f::operator[](&local_100,0);
        nlohmann::detail::
        json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::json_ref<float_&,_0>
                  ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)in_stack_fffffffffffffac0,(float *)in_stack_fffffffffffffab8);
        local_188 = (undefined8 ***)local_160;
        Vector3f::operator[](&local_100,1);
        nlohmann::detail::
        json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::json_ref<float_&,_0>
                  ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)in_stack_fffffffffffffac0,(float *)in_stack_fffffffffffffab8);
        local_188 = (undefined8 ***)local_140;
        Vector3f::operator[](&local_100,2);
        nlohmann::detail::
        json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::json_ref<float_&,_0>
                  ((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    *)in_stack_fffffffffffffac0,(float *)in_stack_fffffffffffffab8);
        local_120 = local_180;
        local_118 = 3;
        init._M_array._4_4_ = in_stack_fffffffffffffb5c;
        init._M_array._0_4_ = in_stack_fffffffffffffb58;
        init._M_len = in_stack_fffffffffffffb60;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json(in_stack_fffffffffffffb50,init,
                     SUB81((ulong)in_stack_fffffffffffffb48 >> 0x38,0),
                     (value_t)((ulong)in_stack_fffffffffffffb48 >> 0x30));
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator[](in_stack_fffffffffffffb30,
                     (key_type *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(in_stack_fffffffffffffad0,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_fffffffffffffac8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_fffffffffffffac0);
        local_3e0 = (undefined1 ****)&local_120;
        do {
          local_3e0 = local_3e0 + -4;
          nlohmann::detail::
          json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       *)0x2ba5e8);
        } while (local_3e0 != local_180);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
               *)0x2ba727);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>
                    *)in_stack_fffffffffffffac0);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<const_char_(&)[6],_char[6],_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_fffffffffffffac0,(char (*) [6])in_stack_fffffffffffffab8);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(in_stack_fffffffffffffad0,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_fffffffffffffac8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffffac0);
    std::weak_ptr<void>::weak_ptr
              ((weak_ptr<void> *)in_stack_fffffffffffffac0,
               (weak_ptr<void> *)in_stack_fffffffffffffab8);
    iVar2 = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,in_stack_fffffffffffffd93,
           (bool)in_stack_fffffffffffffd92,in_stack_fffffffffffffd8c);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    paVar9 = &local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,pcVar5,paVar9);
    websocketpp::
    endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::send
              (in_RDI,(int)local_1a8,local_1c8,1,iVar2);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::__cxx11::string::~string(local_1e8);
    std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x2ba896);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffffac0);
  }
  else {
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    bVar1 = nlohmann::operator==<const_char_*,_0>
                      (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    if (bVar1) {
      (**(code **)((long)&in_RDI[1].super_transport_type.super_socket_type.m_socket_init_handler.
                          super__Function_base._M_functor + 8))
                (in_RDI[1].super_transport_type.super_socket_type.m_socket_init_handler.
                 super__Function_base._M_functor._M_pod_data[0] & 1);
      in_RDI[1].super_transport_type.super_socket_type.m_socket_init_handler.super__Function_base.
      _M_functor._M_pod_data[0] = '\x01';
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<const_char_(&)[6],_char[6],_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffac0,(char (*) [6])in_stack_fffffffffffffab8);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(in_stack_fffffffffffffad0,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffffac8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_fffffffffffffac0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<const_char_(&)[8],_char[8],_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_fffffffffffffac0,(char (*) [8])in_stack_fffffffffffffab8);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=(in_stack_fffffffffffffad0,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_fffffffffffffac8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_fffffffffffffac0);
      std::weak_ptr<void>::weak_ptr
                ((weak_ptr<void> *)in_stack_fffffffffffffac0,
                 (weak_ptr<void> *)in_stack_fffffffffffffab8);
      iVar2 = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::dump(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,in_stack_fffffffffffffd93,
             (bool)in_stack_fffffffffffffd92,in_stack_fffffffffffffd8c);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      paVar9 = (allocator *)&stack0xfffffffffffffd8f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,pcVar5,paVar9);
      websocketpp::
      endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::send
                (in_RDI,(int)local_230,local_250,1,iVar2);
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd8f);
      std::__cxx11::string::~string(local_270);
      std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x2bab72);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_fffffffffffffac0);
    }
    else {
      key = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      bVar1 = nlohmann::operator==<const_char_*,_0>
                        (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
      if (bVar1) {
        in_RDI[1].super_transport_type.super_socket_type.m_socket_init_handler.super__Function_base.
        _M_functor._M_pod_data[0] = '\0';
        local_278 = 0;
        sVar6 = nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::count<char_const(&)[6]>
                          ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                           in_stack_fffffffffffffb20);
        if (sVar6 != 0) {
          local_280 = &in_RDI[1].super_transport_type.super_socket_type.m_socket_init_handler.
                       super__Function_base._M_manager;
          local_288._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
                        *)in_stack_fffffffffffffab8);
          local_290._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
                      *)in_stack_fffffffffffffab8);
          while (bVar1 = std::operator!=(&local_288,&local_290), bVar1) {
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>
            ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>
                         *)0x2bad5c);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
            ::pair(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
            nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>(in_stack_fffffffffffffb80,(char *)key);
            sVar6 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::count<std::__cxx11::string_const&>
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
            if (sVar6 == 0) {
              local_2c4 = 6;
            }
            else {
              local_278 = local_278 + 1;
              local_2d0 = local_2a0;
              if (local_2a0[0] == 0) {
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>(in_stack_fffffffffffffb80,(char *)key);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[](in_stack_fffffffffffffb30,
                             (key_type *)
                             CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
                iVar2 = nlohmann::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        ::operator_int<int,_0>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                    *)0x2bae97);
                **(int **)(local_2d0 + 2) = iVar2;
              }
              else if (local_2a0[0] == 1) {
                nlohmann::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                ::operator[]<char_const>(in_stack_fffffffffffffb80,(char *)key);
                in_stack_fffffffffffffb30 =
                     nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     ::operator[](in_stack_fffffffffffffb30,
                                  (key_type *)
                                  CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
                in_stack_fffffffffffffb2c =
                     nlohmann::
                     basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     ::operator_float<float,_0>
                               ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                 *)0x2baefe);
                **(float **)(local_2d0 + 2) = in_stack_fffffffffffffb2c;
              }
              else if (local_2a0[0] == 2) {
                Vector3f::Vector3f(&local_2dc,0.0);
                for (local_2e0 = 0; local_2e0 < 3; local_2e0 = local_2e0 + 1) {
                  nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::operator[]<char_const>(in_stack_fffffffffffffb80,(char *)key);
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::operator[](in_stack_fffffffffffffb30,
                               (key_type *)
                               CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
                  nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::operator[](in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
                  fVar8 = nlohmann::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          ::operator_float<float,_0>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                      *)0x2bafa4);
                  pfVar7 = Vector3f::operator[](&local_2dc,local_2e0);
                  *pfVar7 = fVar8;
                }
                Vector3f::operator=((Vector3f *)in_stack_fffffffffffffac0,
                                    (Vector3f *)in_stack_fffffffffffffab8);
              }
              local_2c4 = 0;
            }
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
                     *)0x2bb021);
            std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>
            ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>
                          *)in_stack_fffffffffffffac0);
          }
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<const_char_(&)[16],_char[16],_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffac0,(char (*) [16])in_stack_fffffffffffffab8);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb80,(char *)key);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(in_stack_fffffffffffffad0,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_fffffffffffffac8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_fffffffffffffac0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<int_&,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_fffffffffffffac0,(int *)in_stack_fffffffffffffab8);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb80,(char *)key);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=(in_stack_fffffffffffffad0,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_fffffffffffffac8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_fffffffffffffac0);
        std::weak_ptr<void>::weak_ptr
                  ((weak_ptr<void> *)in_stack_fffffffffffffac0,
                   (weak_ptr<void> *)in_stack_fffffffffffffab8);
        iVar2 = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,in_stack_fffffffffffffd93,
               (bool)in_stack_fffffffffffffd92,in_stack_fffffffffffffd8c);
        websocketpp::
        endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>::
        send(in_RDI,(int)local_320,local_340,1,iVar2);
        std::__cxx11::string::~string(local_340);
        std::weak_ptr<void>::~weak_ptr((weak_ptr<void> *)0x2bb17e);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_fffffffffffffac0);
      }
      else {
        std::operator<<((ostream *)&std::cerr,"unsupported request ");
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_fffffffffffffb80,(char *)key);
        in_stack_fffffffffffffac0 =
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>
              *)nlohmann::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        std::operator<<((ostream *)in_stack_fffffffffffffac0,"\n");
      }
    }
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_fffffffffffffac0);
  return;
}

Assistant:

void echo_handler(websocketpp::connection_hdl hdl, server::message_ptr msg) {
		std::cerr << (msg->get_payload()) << std::endl;
		auto j = json::parse(msg->get_payload());
		if (j["type"] == "query")
		{
			json u;
			for (auto t : v)
			{
				const std::pair<ParamType, void*>& p = t.second;
				switch (p.first)
				{
				case PT_INT:
					u["result"][t.first] = int(*((int*)p.second)); break;
				case PT_FLOAT:
					u["result"][t.first] = float(*((float*)p.second)); break;
				case PT_VECTOR3F:
					Vector3f v = Vector3f(*((Vector3f*)p.second));
					u["result"][t.first] = { v[0],v[1],v[2] }; break;
				}
			}
			u["type"] = "query";
			m_endpoint.send(hdl, u.dump().c_str(), websocketpp::frame::opcode::TEXT);
		}
		else if(j["type"] == "shade")
		{
			f(k); k = 1;
			json u;
			u["type"] = "shade";
			u["result"] = "succeed";
			m_endpoint.send(hdl, u.dump().c_str(), websocketpp::frame::opcode::TEXT);
		}
		else if (j["type"] == "edit_parameters")
		{
			k = 0;
			int edt = 0;
			if(j.count("param"))
			for (auto t : v)
			{
				if (!j["param"].count(t.first)) continue;
				++edt;
				const std::pair<ParamType, void*>& p = t.second;
				switch (p.first)
				{
				case PT_INT:
					*((int*)p.second) = (int)j["param"][t.first]; break;
				case PT_FLOAT:
					*((float*)p.second) = (float)j["param"][t.first]; break;
				case PT_VECTOR3F:
					Vector3f tv;
					for (int jj = 0; jj < 3; ++jj) tv[jj] = (float)j["param"][t.first][jj];
					*((Vector3f*)p.second) = tv; break;
				}
			}
			json tmp;
			tmp["type"] = "edit_parameters";
			tmp["result"] = edt;
			m_endpoint.send(hdl, tmp.dump(), websocketpp::frame::opcode::TEXT);
		}
		else
		{
			std::cerr << "unsupported request "<<j["type"]<<"\n";
		}
	}